

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double<long_double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          longdouble value,format_specs *spec)

{
  ulong uVar1;
  alignment aVar2;
  alignment aVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined3 uVar7;
  basic_buffer<char> *pbVar6;
  double_writer f;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  byte bVar11;
  longdouble lVar12;
  inf_or_nan_writer f_00;
  float_spec_handler<char> handler;
  align_spec as;
  write_inf_or_nan_t write_inf_or_nan;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  float_spec_handler<char> local_2ca;
  longdouble local_2c8;
  format_specs local_2b8;
  size_t local_2a0;
  byte bStack_298;
  undefined7 uStack_297;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *local_290;
  undefined1 local_288 [24];
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *local_270;
  undefined1 local_268 [13];
  undefined3 uStack_25b;
  undefined5 uStack_258;
  byte local_250;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  local_2ca.type = spec->type_;
  local_2ca.upper = false;
  if ((byte)local_2ca.type < 0x61) {
    switch(local_2ca.type) {
    case 'A':
    case 'E':
    case 'F':
    case 'G':
      local_2ca.upper = true;
      break;
    case 'B':
    case 'C':
    case 'D':
switchD_00126ace_caseD_42:
      local_2c8 = value;
      float_spec_handler<char>::on_error(&local_2ca);
      value = local_2c8;
      break;
    default:
      if (local_2ca.type != 0) goto switchD_00126ace_caseD_42;
LAB_00126ae9:
      local_2ca.type = 0x67;
    }
  }
  else if ((1 < (byte)local_2ca.type - 0x65) && (local_2ca.type != 0x61)) {
    if (local_2ca.type == 0x67) goto LAB_00126ae9;
    goto switchD_00126ace_caseD_42;
  }
  local_288._8_2_ = (undefined2)((unkuint10)value >> 0x40);
  if ((short)local_288._8_2_ < 0) {
    lVar12 = -value;
    bVar11 = 0x2d;
  }
  else {
    lVar12 = value;
    if ((spec->flags_ & 1) == 0) {
      bVar11 = 0;
    }
    else {
      bVar11 = 0x2b;
      if ((spec->flags_ & 2) == 0) {
        bVar11 = 0x20;
      }
    }
  }
  local_268._0_4_ = (spec->super_align_spec).width_;
  local_268._4_4_ = (spec->super_align_spec).fill_;
  local_268._8_5_ = (undefined5)*(undefined8 *)&(spec->super_align_spec).align_;
  uVar5 = *(undefined8 *)((long)&spec->flags_ + 1);
  uStack_25b = (undefined3)uVar5;
  uStack_258 = (undefined5)((ulong)uVar5 >> 0x18);
  local_288._0_10_ = value;
  local_270 = this;
  local_250 = bVar11;
  if (NAN(lVar12)) {
    pcVar8 = "NAN";
    pcVar10 = "nan";
LAB_00126b81:
    if (local_2ca.upper != false) {
      pcVar10 = pcVar8;
    }
    f_00._1_7_ = 0;
    f_00.sign = bVar11;
    f_00.str = pcVar10;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::inf_or_nan_writer>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,4 - (ulong)(bVar11 == 0),(align_spec *)local_268,f_00);
    return;
  }
  if ((longdouble)INFINITY <= lVar12) {
    pcVar8 = "INF";
    pcVar10 = "inf";
    goto LAB_00126b81;
  }
  local_248.super_basic_buffer<char>.size_ = 0;
  local_248.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_0014eae0;
  local_248.super_basic_buffer<char>.capacity_ = 500;
  uVar4 = spec->precision_;
  uVar7 = *(undefined3 *)&spec->field_0x15;
  local_2b8.super_align_spec.width_ = (spec->super_align_spec).width_;
  local_2b8.super_align_spec.fill_ = (spec->super_align_spec).fill_;
  local_2b8._8_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  local_2b8.type_ = local_2ca.type;
  local_2b8.precision_ = uVar4;
  local_2b8._21_3_ = uVar7;
  local_248.super_basic_buffer<char>.ptr_ = local_248.store_;
  write_double_sprintf<long_double>(this,lVar12,&local_2b8,&local_248.super_basic_buffer<char>);
  local_2a0 = local_248.super_basic_buffer<char>.size_;
  aVar2 = (spec->super_align_spec).align_;
  local_2b8.super_align_spec.width_ = (spec->super_align_spec).width_;
  local_2b8.super_align_spec.fill_ = (spec->super_align_spec).fill_;
  aVar3 = (spec->super_align_spec).align_;
  if (aVar3 == ALIGN_DEFAULT) {
    local_2b8.super_align_spec.align_ = ALIGN_RIGHT;
  }
  else {
    local_2b8.super_align_spec.align_ = aVar2;
    if (aVar3 == ALIGN_NUMERIC) {
      if (bVar11 != 0) {
        pbVar6 = (this->out_).container;
        sVar9 = pbVar6->size_;
        uVar1 = sVar9 + 1;
        if (pbVar6->capacity_ < uVar1) {
          local_2c8 = (longdouble)CONCAT28(local_2c8._8_2_,sVar9);
          (**pbVar6->_vptr_basic_buffer)(pbVar6,uVar1);
          sVar9 = local_2c8._0_8_;
        }
        pbVar6->size_ = uVar1;
        pbVar6->ptr_[sVar9] = bVar11;
        if (local_2b8.super_align_spec.width_ != 0) {
          local_2b8.super_align_spec.width_ = local_2b8.super_align_spec.width_ - 1;
        }
      }
      local_2b8.super_align_spec.align_ = ALIGN_RIGHT;
      bStack_298 = 0;
      goto LAB_00126c8b;
    }
  }
  local_2a0 = (local_248.super_basic_buffer<char>.size_ + 1) - (ulong)(bVar11 == 0);
  bStack_298 = bVar11;
LAB_00126c8b:
  local_290 = &local_248;
  f._8_2_ = (short)CONCAT71(uStack_297,bStack_298);
  f.n = local_2a0;
  f._10_6_ = (int6)((uint7)uStack_297 >> 8);
  f.buffer = local_290;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)this
             ,local_2a0,&local_2b8.super_align_spec,f);
  local_248.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_0014eae0;
  if (local_248.super_basic_buffer<char>.ptr_ == local_248.store_) {
    return;
  }
  operator_delete(local_248.super_basic_buffer<char>.ptr_);
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler<char_type> handler(spec.type());
  internal::handle_float_type_spec(spec.type(), handler);

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::fputil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(INF_SIZE + (sign ? 1 : 0), spec,
                          inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  basic_memory_buffer<char_type> buffer;
  if (FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      std::numeric_limits<double>::is_iec559) {
    internal::fp fp_value(static_cast<double>(value));
    fp_value.normalize();
    // Find a cached power of 10 close to 1 / fp_value.
    int dec_exp = 0;
    const int min_exp = -60;
    auto dec_pow = internal::get_cached_power(
        min_exp - (fp_value.e + internal::fp::significand_size), dec_exp);
    internal::fp product = fp_value * dec_pow;
    // Generate output.
    internal::fp one(1ull << -product.e, product.e);
    uint64_t hi = product.f >> -one.e;
    uint64_t f = product.f & (one.f - 1);
    typedef back_insert_range<internal::basic_buffer<char_type>> range;
    basic_writer<range> w{range(buffer)};
    w.write(hi);
    size_t digits = buffer.size();
    w.write('.');
    const unsigned max_digits = 18;
    while (digits++ < max_digits) {
      f *= 10;
      w.write(static_cast<char>('0' + (f >> -one.e)));
      f &= one.f - 1;
    }
    w.write('e');
    w.write(-dec_exp);
  } else {
    format_specs normalized_spec(spec);
    normalized_spec.type_ = handler.type;
    write_double_sprintf(value, normalized_spec, buffer);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = sign;
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(n, as, double_writer{n, sign, buffer});
}